

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O0

Vec_Int_t * Acb_GetUsedDivs(Vec_Int_t *vDivs,Vec_Int_t *vUsed)

{
  int iVar1;
  Vec_Int_t *p;
  Vec_Int_t *vRes;
  int iObj;
  int i;
  Vec_Int_t *vUsed_local;
  Vec_Int_t *vDivs_local;
  
  iVar1 = Vec_IntSize(vUsed);
  p = Vec_IntAlloc(iVar1);
  for (vRes._4_4_ = 0; iVar1 = Vec_IntSize(vUsed), vRes._4_4_ < iVar1; vRes._4_4_ = vRes._4_4_ + 1)
  {
    iVar1 = Vec_IntEntry(vUsed,vRes._4_4_);
    iVar1 = Vec_IntEntry(vDivs,iVar1);
    Vec_IntPush(p,iVar1);
  }
  return p;
}

Assistant:

Vec_Int_t * Acb_GetUsedDivs( Vec_Int_t * vDivs, Vec_Int_t * vUsed )
{
    int i, iObj;
    Vec_Int_t * vRes = Vec_IntAlloc( Vec_IntSize(vUsed) );
    Vec_IntForEachEntryInVec( vDivs, vUsed, iObj, i )
        Vec_IntPush( vRes, iObj );
    return vRes;
}